

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

string * inja::Parser::load_file(string *__return_storage_ptr__,path *filename)

{
  undefined8 uVar1;
  pointer pcVar2;
  FileError *this;
  long *plVar3;
  size_type *psVar4;
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230 [4];
  byte abStack_210 [200];
  undefined8 auStack_148 [36];
  
  ::std::ifstream::ifstream(local_230);
  ::std::ifstream::open((char *)local_230,(_Ios_Openmode)(filename->_M_pathname)._M_dataplus._M_p);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    uVar1 = *(undefined8 *)((long)auStack_148 + *(long *)(local_230[0] + -0x18));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,uVar1,0xffffffff,0,0xffffffff);
    ::std::ifstream::~ifstream(local_230);
    return __return_storage_ptr__;
  }
  this = (FileError *)__cxa_allocate_exception(0x60);
  pcVar2 = (filename->_M_pathname)._M_dataplus._M_p;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,pcVar2,pcVar2 + (filename->_M_pathname)._M_string_length);
  ::std::operator+(&local_250,"failed accessing file at \'",&local_290);
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_250);
  local_270._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_270._M_dataplus._M_p == psVar4) {
    local_270.field_2._M_allocated_capacity = *psVar4;
    local_270.field_2._8_8_ = plVar3[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar4;
  }
  local_270._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  FileError::FileError(this,&local_270);
  __cxa_throw(this,&FileError::typeinfo,InjaError::~InjaError);
}

Assistant:

static std::string load_file(const std::filesystem::path& filename) {
    std::ifstream file;
    file.open(filename);
    if (file.fail()) {
      INJA_THROW(FileError("failed accessing file at '" + filename.string() + "'"));
    }
    std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
    return text;
  }